

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

UnicodeSet * __thiscall icu_63::UnicodeSet::clear(UnicodeSet *this)

{
  if (this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) {
    if (this->list != (UChar32 *)0x0) {
      *this->list = 0x110000;
    }
    this->len = 1;
    if (this->pat != (char16_t *)0x0) {
      uprv_free_63(this->pat);
      this->pat = (char16_t *)0x0;
      this->patLen = 0;
    }
    if (this->strings != (UVector *)0x0) {
      UVector::removeAllElements(this->strings);
    }
    if ((this->list != (UChar32 *)0x0) && (this->strings != (UVector *)0x0)) {
      this->fFlags = '\0';
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::clear(void) {
    if (isFrozen()) {
        return *this;
    }
    if (list != NULL) {
        list[0] = UNICODESET_HIGH;
    }
    len = 1;
    releasePattern();
    if (strings != NULL) {
        strings->removeAllElements();
    }
    if (list != NULL && strings != NULL) {
        // Remove bogus
        fFlags = 0;
    }
    return *this;
}